

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

int ply_read_word(p_ply ply)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t t;
  p_ply ply_local;
  
  if (((ply == (p_ply)0x0) || (ply->fp == (FILE *)0x0)) || (ply->io_mode != PLY_READ)) {
    __assert_fail("ply && ply->fp && ply->io_mode == PLY_READ",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x3c1,"int ply_read_word(p_ply)");
  }
  while (sVar2 = strspn(ply->buffer + ply->buffer_first," \n\r\t"),
        ply->buffer_last - ply->buffer_first <= sVar2) {
    iVar1 = BREFILL(ply);
    if (iVar1 == 0) {
      ply_ferror(ply,"Unexpected end of file");
      return 0;
    }
  }
  ply->buffer_first = sVar2 + ply->buffer_first;
  sVar2 = strcspn(ply->buffer + ply->buffer_first," \n\r\t");
  if (sVar2 < ply->buffer_last - ply->buffer_first) {
    ply_finish_word(ply,sVar2);
    iVar1 = ply_check_word(ply);
    return iVar1;
  }
  iVar1 = BREFILL(ply);
  if (iVar1 == 0) {
    ply_finish_word(ply,sVar2);
    iVar1 = ply_check_word(ply);
    return iVar1;
  }
  sVar3 = strcspn(ply->buffer + sVar2 + ply->buffer_first," \n\r\t");
  if (ply->buffer_last - ply->buffer_first <= sVar3 + sVar2) {
    ply_ferror(ply,"Token too large");
    return 0;
  }
  ply_finish_word(ply,sVar3 + sVar2);
  iVar1 = ply_check_word(ply);
  return iVar1;
}

Assistant:

static int ply_read_word(p_ply ply) {
    size_t t = 0;
    assert(ply && ply->fp && ply->io_mode == PLY_READ);
    /* skip leading blanks */
    while (1) {
        t = strspn(BFIRST(ply), " \n\r\t");
        /* check if all buffer was made of blanks */
        if (t >= BSIZE(ply)) {
            if (!BREFILL(ply)) {
                ply_ferror(ply, "Unexpected end of file");
                return 0;
            }
        } else break;
    }
    BSKIP(ply, t);
    /* look for a space after the current word */
    t = strcspn(BFIRST(ply), " \n\r\t");
    /* if we didn't reach the end of the buffer, we are done */
    if (t < BSIZE(ply)) {
        ply_finish_word(ply, t);
        return ply_check_word(ply);
    }
    /* otherwise, try to refill buffer */
    if (!BREFILL(ply)) {
        /* if we reached the end of file, try to do with what we have */
        ply_finish_word(ply, t);
        return ply_check_word(ply);
        /* ply_ferror(ply, "Unexpected end of file"); */
        /* return 0; */
    }
    /* keep looking from where we left */
    t += strcspn(BFIRST(ply) + t, " \n\r\t");
    /* check if the token is too large for our buffer */
    if (t >= BSIZE(ply)) {
        ply_ferror(ply, "Token too large");
        return 0;
    }
    /* we are done */
    ply_finish_word(ply, t);
    return ply_check_word(ply);
}